

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int StartScanThreadRPLIDARx(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  long lVar2;
  CRITICAL_SECTION *pCriticalSection;
  THREAD_IDENTIFIER *pThreadId;
  
  pCriticalSection = RPLIDARCS;
  pThreadId = RPLIDARScanThreadId;
  lVar2 = 0;
  do {
    if (*(RPLIDAR **)((long)addrsRPLIDAR + lVar2 * 2) == pRPLIDAR) {
      *(undefined4 *)((long)resRPLIDAR + lVar2) = 1;
      *(undefined4 *)((long)bExitScanRPLIDAR + lVar2) = 0;
      InitCriticalSection(pCriticalSection);
      iVar1 = CreateDefaultThread(RPLIDARScanThread,pRPLIDAR,pThreadId);
      return iVar1;
    }
    lVar2 = lVar2 + 4;
    pCriticalSection = pCriticalSection + 1;
    pThreadId = pThreadId + 1;
  } while (lVar2 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartScanThreadRPLIDARx(RPLIDAR* pRPLIDAR)
{
	int id = 0;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resRPLIDAR[id] = EXIT_FAILURE;
	bExitScanRPLIDAR[id] = FALSE;
	InitCriticalSection(&RPLIDARCS[id]);
	return CreateDefaultThread(RPLIDARScanThread, (void*)pRPLIDAR, &RPLIDARScanThreadId[id]);
}